

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall pybind11::gil_scoped_acquire::gil_scoped_acquire(gil_scoped_acquire *this)

{
  int *piVar1;
  internals *piVar2;
  PyThreadState *pPVar3;
  
  this->tstate = (PyThreadState *)0x0;
  this->release = true;
  piVar2 = detail::get_internals();
  pPVar3 = (PyThreadState *)PyThread_get_key_value(piVar2->tstate);
  this->tstate = pPVar3;
  if (pPVar3 == (PyThreadState *)0x0) {
    pPVar3 = (PyThreadState *)PyThreadState_New(piVar2->istate);
    this->tstate = pPVar3;
    if (pPVar3 == (PyThreadState *)0x0) {
      pybind11_fail("scoped_acquire: could not create thread state!");
    }
    pPVar3->gilstate_counter = 0;
    PyThread_set_key_value(piVar2->tstate,pPVar3);
  }
  else {
    pPVar3 = (PyThreadState *)_PyThreadState_UncheckedGet();
    this->release = pPVar3 != this->tstate;
  }
  if (this->release == true) {
    PyEval_AcquireThread(this->tstate);
  }
  piVar1 = &this->tstate->gilstate_counter;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

PYBIND11_NOINLINE gil_scoped_acquire() {
        auto const &internals = detail::get_internals();
        tstate = (PyThreadState *) PyThread_get_key_value(internals.tstate);

        if (!tstate) {
            tstate = PyThreadState_New(internals.istate);
            #if !defined(NDEBUG)
                if (!tstate)
                    pybind11_fail("scoped_acquire: could not create thread state!");
            #endif
            tstate->gilstate_counter = 0;
            #if PY_MAJOR_VERSION < 3
                PyThread_delete_key_value(internals.tstate);
            #endif
            PyThread_set_key_value(internals.tstate, tstate);
        } else {
            release = detail::get_thread_state_unchecked() != tstate;
        }

        if (release) {
            /* Work around an annoying assertion in PyThreadState_Swap */
            #if defined(Py_DEBUG)
                PyInterpreterState *interp = tstate->interp;
                tstate->interp = nullptr;
            #endif
            PyEval_AcquireThread(tstate);
            #if defined(Py_DEBUG)
                tstate->interp = interp;
            #endif
        }

        inc_ref();
    }